

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_cgmres.cpp
# Opt level: O1

void __thiscall
InitCGMRES::InitCGMRES(InitCGMRES *this,NMPCModel model,double difference_increment,int dim_krylov)

{
  NMPCModel *this_00;
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar3 = NMPCModel::dimControlInput(&model);
  iVar4 = NMPCModel::dimConstraints(&model);
  MatrixFreeGMRES::MatrixFreeGMRES(&this->super_MatrixFreeGMRES,iVar3 + iVar4,dim_krylov);
  (this->super_MatrixFreeGMRES)._vptr_MatrixFreeGMRES = (_func_int **)&PTR_bFunc_00120d68;
  this_00 = &this->model_;
  (this->model_).q[0] = 1.0;
  (this->model_).q[1] = 1.0;
  (this->model_).r[0] = 0.1;
  (this->model_).q_terminal[0] = 1.0;
  (this->model_).q_terminal[1] = 1.0;
  (this->model_).x_ref[0] = 3.5;
  (this->model_).x_ref[1] = 0.0;
  (this->solution_update_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->solution_update_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->incremented_solution_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->incremented_solution_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->lambda_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->lambda_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->error_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->error_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->error_vec_1_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->error_vec_1_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->error_vec_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->error_vec_2_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->model_).q_terminal[1] = model.q_terminal[1];
  (this->model_).x_ref[0] = model.x_ref[0];
  (this->model_).x_ref[1] = model.x_ref[1];
  (this->model_).q[0] = model.q[0];
  (this->model_).q[1] = model.q[1];
  (this->model_).r[0] = model.r[0];
  (this->model_).q_terminal[0] = model.q_terminal[0];
  this->difference_increment_ = difference_increment;
  iVar3 = NMPCModel::dimControlInput(this_00);
  iVar4 = NMPCModel::dimConstraints(this_00);
  uVar5 = iVar4 + iVar3;
  this->dim_solution_ = uVar5;
  if (-1 < (int)uVar5) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->solution_update_vec_,(ulong)uVar5,
               (ulong)uVar5,1);
    lVar6 = (long)this->dim_solution_;
    if (-1 < lVar6) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)&this->incremented_solution_vec_,lVar6,lVar6,
                 1);
      uVar5 = NMPCModel::dimState(this_00);
      if (-1 < (int)uVar5) {
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)&this->lambda_vec_,(ulong)uVar5,
                   (ulong)uVar5,1);
        lVar6 = (long)this->dim_solution_;
        if (-1 < lVar6) {
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    ((DenseStorage<double,__1,__1,_1,_0> *)&this->error_vec_,lVar6,lVar6,1);
          lVar6 = (long)this->dim_solution_;
          if (-1 < lVar6) {
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<double,__1,__1,_1,_0> *)&this->error_vec_1_,lVar6,lVar6,1);
            lVar6 = (long)this->dim_solution_;
            if (-1 < lVar6) {
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                        ((DenseStorage<double,__1,__1,_1,_0> *)&this->error_vec_2_,lVar6,lVar6,1);
              iVar3 = this->dim_solution_;
              if (0 < (long)iVar3) {
                pdVar1 = (this->solution_update_vec_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
                lVar6 = (this->solution_update_vec_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows;
                lVar7 = (this->error_vec_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows;
                lVar8 = 0;
                if (lVar6 < 1) {
                  lVar6 = lVar8;
                }
                pdVar2 = (this->error_vec_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
                if (lVar7 < 1) {
                  lVar7 = lVar8;
                }
                do {
                  if ((lVar6 == lVar8) || (pdVar1[lVar8] = 0.0, lVar7 == lVar8)) {
                    __assert_fail("index >= 0 && index < size()",
                                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                                 );
                  }
                  pdVar2[lVar8] = 0.0;
                  lVar8 = lVar8 + 1;
                } while (iVar3 != lVar8);
              }
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

InitCGMRES::InitCGMRES(const NMPCModel model, const double difference_increment, const int dim_krylov) : MatrixFreeGMRES(model.dimControlInput()+model.dimConstraints(), dim_krylov)
{
    // Set parameters.
    model_ = model;
    difference_increment_ = difference_increment;
    dim_solution_ = model_.dimControlInput()+model_.dimConstraints();

    // Allocate vectors.
    solution_update_vec_.resize(dim_solution_);
    incremented_solution_vec_.resize(dim_solution_);
    lambda_vec_.resize(model_.dimState());
    error_vec_.resize(dim_solution_);
    error_vec_1_.resize(dim_solution_);
    error_vec_2_.resize(dim_solution_);

    // Initialize solution of the forward-difference GMRES.
    for(int i=0; i<dim_solution_; i++){
        solution_update_vec_(i) = 0.0;
        error_vec_(i) = 0.0;
    }
}